

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::Cluster::CreateBlock
          (Cluster *this,longlong id,longlong pos,longlong size,longlong discard_padding)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  void *pvVar5;
  ulong uVar6;
  undefined8 *puVar7;
  long in_RSI;
  long in_RDI;
  longlong unaff_retaddr;
  Cluster *in_stack_00000008;
  BlockEntry **dst;
  BlockEntry **src_end;
  BlockEntry **src;
  BlockEntry **entries;
  long entries_size;
  longlong in_stack_00000088;
  longlong in_stack_00000090;
  longlong in_stack_00000098;
  Cluster *in_stack_000000a0;
  undefined8 *local_58;
  undefined8 *local_48;
  longlong in_stack_fffffffffffffff8;
  long lVar8;
  
  if ((in_RSI == 0xa0) || (in_RSI == 0xa3)) {
    if (*(long *)(in_RDI + 0x40) < 0) {
      *(undefined8 *)(in_RDI + 0x38) = 0x400;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)(in_RDI + 0x38);
      uVar4 = SUB168(auVar2 * ZEXT816(8),0);
      if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
        uVar4 = 0xffffffffffffffff;
      }
      pvVar5 = operator_new__(uVar4,(nothrow_t *)&std::nothrow);
      *(void **)(in_RDI + 0x30) = pvVar5;
      if (*(long *)(in_RDI + 0x30) == 0) {
        return -1;
      }
      *(undefined8 *)(in_RDI + 0x40) = 0;
    }
    else if (*(long *)(in_RDI + 0x38) <= *(long *)(in_RDI + 0x40)) {
      uVar4 = *(long *)(in_RDI + 0x38) << 1;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar4;
      uVar6 = SUB168(auVar3 * ZEXT816(8),0);
      if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
        uVar6 = 0xffffffffffffffff;
      }
      puVar7 = (undefined8 *)operator_new__(uVar6,(nothrow_t *)&std::nothrow);
      if (puVar7 == (undefined8 *)0x0) {
        return -1;
      }
      puVar1 = *(undefined8 **)(in_RDI + 0x30);
      lVar8 = *(long *)(in_RDI + 0x40);
      local_58 = puVar7;
      local_48 = puVar1;
      while (local_48 != puVar1 + lVar8) {
        *local_58 = *local_48;
        local_58 = local_58 + 1;
        local_48 = local_48 + 1;
      }
      if (*(void **)(in_RDI + 0x30) != (void *)0x0) {
        operator_delete__(*(void **)(in_RDI + 0x30));
      }
      *(undefined8 **)(in_RDI + 0x30) = puVar7;
      *(ulong *)(in_RDI + 0x38) = uVar4;
    }
    if (in_RSI == 0xa0) {
      lVar8 = CreateBlockGroup(in_stack_000000a0,in_stack_00000098,in_stack_00000090,
                               in_stack_00000088);
    }
    else {
      lVar8 = CreateSimpleBlock(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8);
    }
  }
  else {
    lVar8 = -1;
  }
  return lVar8;
}

Assistant:

long Cluster::CreateBlock(long long id,
                          long long pos,  // absolute pos of payload
                          long long size, long long discard_padding) {
  if (id != libwebm::kMkvBlockGroup && id != libwebm::kMkvSimpleBlock)
    return E_PARSE_FAILED;

  if (m_entries_count < 0) {  // haven't parsed anything yet
    assert(m_entries == NULL);
    assert(m_entries_size == 0);

    m_entries_size = 1024;
    m_entries = new (std::nothrow) BlockEntry*[m_entries_size];
    if (m_entries == NULL)
      return -1;

    m_entries_count = 0;
  } else {
    assert(m_entries);
    assert(m_entries_size > 0);
    assert(m_entries_count <= m_entries_size);

    if (m_entries_count >= m_entries_size) {
      const long entries_size = 2 * m_entries_size;

      BlockEntry** const entries = new (std::nothrow) BlockEntry*[entries_size];
      if (entries == NULL)
        return -1;

      BlockEntry** src = m_entries;
      BlockEntry** const src_end = src + m_entries_count;

      BlockEntry** dst = entries;

      while (src != src_end)
        *dst++ = *src++;

      delete[] m_entries;

      m_entries = entries;
      m_entries_size = entries_size;
    }
  }

  if (id == libwebm::kMkvBlockGroup)
    return CreateBlockGroup(pos, size, discard_padding);
  else
    return CreateSimpleBlock(pos, size);
}